

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::PhpName
                   (string *__return_storage_ptr__,string *full_name,bool is_descriptor)

{
  char cVar1;
  undefined7 in_register_00000011;
  bool bVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)CONCAT71(in_register_00000011,is_descriptor) == 0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (full_name->_M_string_length != 0) {
      bVar2 = true;
      uVar3 = 0;
      do {
        cVar1 = (full_name->_M_dataplus)._M_p[uVar3];
        if (((bVar2) && ((byte)(cVar1 + 0x9fU) < 0x1a)) || (cVar1 != '.')) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar2 = false;
        }
        else {
          bVar2 = true;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < full_name->_M_string_length);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p,
               kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p +
               kDescriptorPackageName_abi_cxx11_._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, bool is_descriptor) {
  if (is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      result += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += '\\';
      cap_next_letter = true;
    } else {
      result += full_name[i];
      cap_next_letter = false;
    }
  }
  return result;
}